

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::Grow
          (RepeatedField<double> *this,bool was_soo,int old_size,int new_size)

{
  int old_size_00;
  int new_size_local;
  int old_size_local;
  bool was_soo_local;
  RepeatedField<double> *this_local;
  
  UnpoisonBuffer(this);
  GrowNoAnnotate(this,was_soo,old_size,new_size);
  old_size_00 = Capacity(this);
  AnnotateSize(this,old_size_00,old_size);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::Grow(bool was_soo, int old_size,
                                                    int new_size) {
  UnpoisonBuffer();
  GrowNoAnnotate(was_soo, old_size, new_size);
  AnnotateSize(Capacity(), old_size);
}